

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O2

void __thiscall
r_exec::InputLessPGMController::InputLessPGMController(InputLessPGMController *this,View *ipgm_view)

{
  atomic_int_fast64_t *paVar1;
  InputLessPGMOverlay *this_00;
  P<r_exec::Overlay> local_20;
  
  _PGMController::_PGMController(&this->super__PGMController,ipgm_view);
  (this->super__PGMController).super_OController.super_Controller.super__Object._vptr__Object =
       (_func_int **)&PTR__InputLessPGMController_001d2ed0;
  (this->m_hostMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_hostMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_hostMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_hostMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_hostMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this_00 = (InputLessPGMOverlay *)operator_new(0x80);
  InputLessPGMOverlay::InputLessPGMOverlay(this_00,(Controller *)this);
  LOCK();
  paVar1 = &(this_00->super_Overlay).super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_20.object = (_Object *)this_00;
  r_code::list<core::P<r_exec::Overlay>_>::push_back
            (&(this->super__PGMController).super_OController.overlays,&local_20);
  core::P<r_exec::Overlay>::~P(&local_20);
  return;
}

Assistant:

InputLessPGMController::InputLessPGMController(r_code::View *ipgm_view): _PGMController(ipgm_view)
{
    overlays.push_back(new InputLessPGMOverlay(this));
}